

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::PatternMap::add
          (PatternMap *this,UnicodeString *basePattern,PtnSkeleton *skeleton,UnicodeString *value,
          UBool skeletonWasSpecified,UErrorCode *status)

{
  PtnElem *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  char16_t cVar10;
  PtnElem *pPVar11;
  PtnElem *pPVar12;
  PtnSkeleton *pPVar13;
  UnicodeString *pUVar14;
  PatternMap *this_00;
  
  pUVar14 = (UnicodeString *)0x0;
  this_00 = (PatternMap *)basePattern;
  cVar10 = icu_63::UnicodeString::doCharAt(basePattern,0);
  *status = U_ZERO_ERROR;
  if ((ushort)(cVar10 + L'﾿') < 0x1a) {
    iVar9 = -0x41;
  }
  else {
    if (0x19 < (ushort)(cVar10 + L'ﾟ')) {
      *status = U_ILLEGAL_CHARACTER;
      return;
    }
    iVar9 = -0x47;
  }
  pPVar12 = this->boot[iVar9 + (uint)(ushort)cVar10];
  if (pPVar12 == (PtnElem *)0x0) {
    pPVar12 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar14);
    if (pPVar12 != (PtnElem *)0x0) {
      PtnElem::PtnElem(pPVar12,basePattern,value);
      pUVar14 = basePattern;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR && pPVar12 == (PtnElem *)0x0) goto LAB_002d699f;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pPVar13 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)pUVar14);
      if (pPVar13 != (PtnSkeleton *)0x0) {
        pPVar13->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
        (pPVar13->original).chars[0] = '\0';
        (pPVar13->original).chars[1] = '\0';
        (pPVar13->original).chars[2] = '\0';
        (pPVar13->original).chars[3] = '\0';
        (pPVar13->original).chars[4] = '\0';
        (pPVar13->original).chars[5] = '\0';
        (pPVar13->original).chars[6] = '\0';
        (pPVar13->original).chars[7] = '\0';
        (pPVar13->original).chars[8] = '\0';
        (pPVar13->original).chars[9] = '\0';
        (pPVar13->original).chars[10] = '\0';
        (pPVar13->original).chars[0xb] = '\0';
        (pPVar13->original).chars[0xc] = '\0';
        (pPVar13->original).chars[0xd] = '\0';
        (pPVar13->original).chars[0xe] = '\0';
        (pPVar13->original).chars[0xf] = '\0';
        (pPVar13->original).lengths[0] = '\0';
        (pPVar13->original).lengths[1] = '\0';
        (pPVar13->original).lengths[2] = '\0';
        (pPVar13->original).lengths[3] = '\0';
        (pPVar13->original).lengths[4] = '\0';
        (pPVar13->original).lengths[5] = '\0';
        (pPVar13->original).lengths[6] = '\0';
        (pPVar13->original).lengths[7] = '\0';
        (pPVar13->original).lengths[8] = '\0';
        (pPVar13->original).lengths[9] = '\0';
        (pPVar13->original).lengths[10] = '\0';
        (pPVar13->original).lengths[0xb] = '\0';
        (pPVar13->original).lengths[0xc] = '\0';
        (pPVar13->original).lengths[0xd] = '\0';
        (pPVar13->original).lengths[0xe] = '\0';
        (pPVar13->original).lengths[0xf] = '\0';
        (pPVar13->baseOriginal).chars[0] = '\0';
        (pPVar13->baseOriginal).chars[1] = '\0';
        (pPVar13->baseOriginal).chars[2] = '\0';
        (pPVar13->baseOriginal).chars[3] = '\0';
        (pPVar13->baseOriginal).chars[4] = '\0';
        (pPVar13->baseOriginal).chars[5] = '\0';
        (pPVar13->baseOriginal).chars[6] = '\0';
        (pPVar13->baseOriginal).chars[7] = '\0';
        (pPVar13->baseOriginal).chars[8] = '\0';
        (pPVar13->baseOriginal).chars[9] = '\0';
        (pPVar13->baseOriginal).chars[10] = '\0';
        (pPVar13->baseOriginal).chars[0xb] = '\0';
        (pPVar13->baseOriginal).chars[0xc] = '\0';
        (pPVar13->baseOriginal).chars[0xd] = '\0';
        (pPVar13->baseOriginal).chars[0xe] = '\0';
        (pPVar13->baseOriginal).chars[0xf] = '\0';
        (pPVar13->baseOriginal).lengths[0] = '\0';
        (pPVar13->baseOriginal).lengths[1] = '\0';
        (pPVar13->baseOriginal).lengths[2] = '\0';
        (pPVar13->baseOriginal).lengths[3] = '\0';
        (pPVar13->baseOriginal).lengths[4] = '\0';
        (pPVar13->baseOriginal).lengths[5] = '\0';
        (pPVar13->baseOriginal).lengths[6] = '\0';
        (pPVar13->baseOriginal).lengths[7] = '\0';
        (pPVar13->baseOriginal).lengths[8] = '\0';
        (pPVar13->baseOriginal).lengths[9] = '\0';
        (pPVar13->baseOriginal).lengths[10] = '\0';
        (pPVar13->baseOriginal).lengths[0xb] = '\0';
        (pPVar13->baseOriginal).lengths[0xc] = '\0';
        (pPVar13->baseOriginal).lengths[0xd] = '\0';
        (pPVar13->baseOriginal).lengths[0xe] = '\0';
        (pPVar13->baseOriginal).lengths[0xf] = '\0';
        uVar2 = *(undefined8 *)skeleton->type;
        uVar3 = *(undefined8 *)(skeleton->type + 2);
        uVar4 = *(undefined8 *)(skeleton->type + 4);
        uVar5 = *(undefined8 *)(skeleton->type + 6);
        uVar6 = *(undefined8 *)(skeleton->type + 8);
        uVar7 = *(undefined8 *)(skeleton->type + 10);
        uVar8 = *(undefined8 *)(skeleton->type + 0xe);
        *(undefined8 *)(pPVar13->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
        *(undefined8 *)(pPVar13->type + 0xe) = uVar8;
        *(undefined8 *)(pPVar13->type + 8) = uVar6;
        *(undefined8 *)(pPVar13->type + 10) = uVar7;
        *(undefined8 *)(pPVar13->type + 4) = uVar4;
        *(undefined8 *)(pPVar13->type + 6) = uVar5;
        *(undefined8 *)pPVar13->type = uVar2;
        *(undefined8 *)(pPVar13->type + 2) = uVar3;
        uVar2 = *(undefined8 *)((skeleton->original).chars + 8);
        *(undefined8 *)(pPVar13->original).chars = *(undefined8 *)(skeleton->original).chars;
        *(undefined8 *)((pPVar13->original).chars + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->original).lengths + 8);
        *(undefined8 *)(pPVar13->original).lengths = *(undefined8 *)(skeleton->original).lengths;
        *(undefined8 *)((pPVar13->original).lengths + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
        *(undefined8 *)(pPVar13->baseOriginal).chars = *(undefined8 *)(skeleton->baseOriginal).chars
        ;
        *(undefined8 *)((pPVar13->baseOriginal).chars + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
        *(undefined8 *)(pPVar13->baseOriginal).lengths =
             *(undefined8 *)(skeleton->baseOriginal).lengths;
        *(undefined8 *)((pPVar13->baseOriginal).lengths + 8) = uVar2;
      }
      LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                (&pPVar12->skeleton,pPVar13,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pPVar12->skeletonWasSpecified = skeletonWasSpecified;
        if (0x60 < (ushort)cVar10) {
          this->boot[(ushort)cVar10 - 0x47] = pPVar12;
          return;
        }
        *(PtnElem **)((long)this + (ulong)(uint)(ushort)cVar10 * 8 + -0x200) = pPVar12;
        return;
      }
    }
  }
  else {
    pUVar14 = basePattern;
    pPVar11 = getDuplicateElem(this_00,basePattern,skeleton,pPVar12);
    if (pPVar11 != (PtnElem *)0x0) {
      if (this->isDupAllowed == '\0') {
        return;
      }
      icu_63::UnicodeString::operator=(&pPVar11->pattern,value);
      pPVar11->skeletonWasSpecified = skeletonWasSpecified;
      return;
    }
    do {
      pPVar11 = pPVar12;
      pPVar12 = (pPVar11->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
    } while (pPVar12 != (PtnElem *)0x0);
    pPVar12 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar14);
    if (pPVar12 != (PtnElem *)0x0) {
      PtnElem::PtnElem(pPVar12,basePattern,value);
      pUVar14 = basePattern;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR && pPVar12 == (PtnElem *)0x0) {
LAB_002d699f:
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pPVar13 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)pUVar14);
      if (pPVar13 != (PtnSkeleton *)0x0) {
        pPVar13->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
        (pPVar13->original).chars[0] = '\0';
        (pPVar13->original).chars[1] = '\0';
        (pPVar13->original).chars[2] = '\0';
        (pPVar13->original).chars[3] = '\0';
        (pPVar13->original).chars[4] = '\0';
        (pPVar13->original).chars[5] = '\0';
        (pPVar13->original).chars[6] = '\0';
        (pPVar13->original).chars[7] = '\0';
        (pPVar13->original).chars[8] = '\0';
        (pPVar13->original).chars[9] = '\0';
        (pPVar13->original).chars[10] = '\0';
        (pPVar13->original).chars[0xb] = '\0';
        (pPVar13->original).chars[0xc] = '\0';
        (pPVar13->original).chars[0xd] = '\0';
        (pPVar13->original).chars[0xe] = '\0';
        (pPVar13->original).chars[0xf] = '\0';
        (pPVar13->original).lengths[0] = '\0';
        (pPVar13->original).lengths[1] = '\0';
        (pPVar13->original).lengths[2] = '\0';
        (pPVar13->original).lengths[3] = '\0';
        (pPVar13->original).lengths[4] = '\0';
        (pPVar13->original).lengths[5] = '\0';
        (pPVar13->original).lengths[6] = '\0';
        (pPVar13->original).lengths[7] = '\0';
        (pPVar13->original).lengths[8] = '\0';
        (pPVar13->original).lengths[9] = '\0';
        (pPVar13->original).lengths[10] = '\0';
        (pPVar13->original).lengths[0xb] = '\0';
        (pPVar13->original).lengths[0xc] = '\0';
        (pPVar13->original).lengths[0xd] = '\0';
        (pPVar13->original).lengths[0xe] = '\0';
        (pPVar13->original).lengths[0xf] = '\0';
        (pPVar13->baseOriginal).chars[0] = '\0';
        (pPVar13->baseOriginal).chars[1] = '\0';
        (pPVar13->baseOriginal).chars[2] = '\0';
        (pPVar13->baseOriginal).chars[3] = '\0';
        (pPVar13->baseOriginal).chars[4] = '\0';
        (pPVar13->baseOriginal).chars[5] = '\0';
        (pPVar13->baseOriginal).chars[6] = '\0';
        (pPVar13->baseOriginal).chars[7] = '\0';
        (pPVar13->baseOriginal).chars[8] = '\0';
        (pPVar13->baseOriginal).chars[9] = '\0';
        (pPVar13->baseOriginal).chars[10] = '\0';
        (pPVar13->baseOriginal).chars[0xb] = '\0';
        (pPVar13->baseOriginal).chars[0xc] = '\0';
        (pPVar13->baseOriginal).chars[0xd] = '\0';
        (pPVar13->baseOriginal).chars[0xe] = '\0';
        (pPVar13->baseOriginal).chars[0xf] = '\0';
        (pPVar13->baseOriginal).lengths[0] = '\0';
        (pPVar13->baseOriginal).lengths[1] = '\0';
        (pPVar13->baseOriginal).lengths[2] = '\0';
        (pPVar13->baseOriginal).lengths[3] = '\0';
        (pPVar13->baseOriginal).lengths[4] = '\0';
        (pPVar13->baseOriginal).lengths[5] = '\0';
        (pPVar13->baseOriginal).lengths[6] = '\0';
        (pPVar13->baseOriginal).lengths[7] = '\0';
        (pPVar13->baseOriginal).lengths[8] = '\0';
        (pPVar13->baseOriginal).lengths[9] = '\0';
        (pPVar13->baseOriginal).lengths[10] = '\0';
        (pPVar13->baseOriginal).lengths[0xb] = '\0';
        (pPVar13->baseOriginal).lengths[0xc] = '\0';
        (pPVar13->baseOriginal).lengths[0xd] = '\0';
        (pPVar13->baseOriginal).lengths[0xe] = '\0';
        (pPVar13->baseOriginal).lengths[0xf] = '\0';
        uVar2 = *(undefined8 *)skeleton->type;
        uVar3 = *(undefined8 *)(skeleton->type + 2);
        uVar4 = *(undefined8 *)(skeleton->type + 4);
        uVar5 = *(undefined8 *)(skeleton->type + 6);
        uVar6 = *(undefined8 *)(skeleton->type + 8);
        uVar7 = *(undefined8 *)(skeleton->type + 10);
        uVar8 = *(undefined8 *)(skeleton->type + 0xe);
        *(undefined8 *)(pPVar13->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
        *(undefined8 *)(pPVar13->type + 0xe) = uVar8;
        *(undefined8 *)(pPVar13->type + 8) = uVar6;
        *(undefined8 *)(pPVar13->type + 10) = uVar7;
        *(undefined8 *)(pPVar13->type + 4) = uVar4;
        *(undefined8 *)(pPVar13->type + 6) = uVar5;
        *(undefined8 *)pPVar13->type = uVar2;
        *(undefined8 *)(pPVar13->type + 2) = uVar3;
        uVar2 = *(undefined8 *)((skeleton->original).chars + 8);
        *(undefined8 *)(pPVar13->original).chars = *(undefined8 *)(skeleton->original).chars;
        *(undefined8 *)((pPVar13->original).chars + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->original).lengths + 8);
        *(undefined8 *)(pPVar13->original).lengths = *(undefined8 *)(skeleton->original).lengths;
        *(undefined8 *)((pPVar13->original).lengths + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
        *(undefined8 *)(pPVar13->baseOriginal).chars = *(undefined8 *)(skeleton->baseOriginal).chars
        ;
        *(undefined8 *)((pPVar13->baseOriginal).chars + 8) = uVar2;
        uVar2 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
        *(undefined8 *)(pPVar13->baseOriginal).lengths =
             *(undefined8 *)(skeleton->baseOriginal).lengths;
        *(undefined8 *)((pPVar13->baseOriginal).lengths + 8) = uVar2;
      }
      LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                (&pPVar12->skeleton,pPVar13,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pPVar12->skeletonWasSpecified = skeletonWasSpecified;
        pPVar1 = (pPVar11->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
        if (pPVar1 != (PtnElem *)0x0) {
          (*pPVar1->_vptr_PtnElem[1])();
        }
        (pPVar11->next).super_LocalPointerBase<icu_63::PtnElem>.ptr = pPVar12;
        return;
      }
    }
  }
  if (pPVar12 == (PtnElem *)0x0) {
    return;
  }
  (*pPVar12->_vptr_PtnElem[1])(pPVar12);
  return;
}

Assistant:

void
PatternMap::add(const UnicodeString& basePattern,
                const PtnSkeleton& skeleton,
                const UnicodeString& value,// mapped pattern value
                UBool skeletonWasSpecified,
                UErrorCode &status) {
    UChar baseChar = basePattern.charAt(0);
    PtnElem *curElem, *baseElem;
    status = U_ZERO_ERROR;

    // the baseChar must be A-Z or a-z
    if ((baseChar >= CAP_A) && (baseChar <= CAP_Z)) {
        baseElem = boot[baseChar-CAP_A];
    }
    else {
        if ((baseChar >=LOW_A) && (baseChar <= LOW_Z)) {
            baseElem = boot[26+baseChar-LOW_A];
         }
         else {
             status = U_ILLEGAL_CHARACTER;
             return;
         }
    }

    if (baseElem == nullptr) {
        LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeletonWasSpecified = skeletonWasSpecified;
        if (baseChar >= LOW_A) {
            boot[26 + (baseChar - LOW_A)] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
        else {
            boot[baseChar - CAP_A] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
    }
    if ( baseElem != nullptr ) {
        curElem = getDuplicateElem(basePattern, skeleton, baseElem);

        if (curElem == nullptr) {
            // add new element to the list.
            curElem = baseElem;
            while( curElem -> next != nullptr )
            {
                curElem = curElem->next.getAlias();
            }

            LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeletonWasSpecified = skeletonWasSpecified;
            curElem->next.adoptInstead(newElem.orphan());
            curElem = curElem->next.getAlias();
        }
        else {
            // Pattern exists in the list already.
            if ( !isDupAllowed ) {
                return;
            }
            // Overwrite the value.
            curElem->pattern = value;
            // It was a bug that we were not doing the following previously,
            // though that bug hid other problems by making things partly work.
            curElem->skeletonWasSpecified = skeletonWasSpecified;
        }
    }
}